

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.h
# Opt level: O3

void __thiscall IR::MultiBranchInstr::MultiBranchInstr(MultiBranchInstr *this)

{
  undefined1 *puVar1;
  
  (this->super_BranchInstr).super_Instr.m_noLazyHelperAssert = false;
  (this->super_BranchInstr).super_Instr.m_next = (Instr *)0x0;
  (this->super_BranchInstr).super_Instr.m_prev = (Instr *)0x0;
  (this->super_BranchInstr).super_Instr.m_func = (Func *)0x0;
  (this->super_BranchInstr).super_Instr.globOptInstrString = (char16 *)0x0;
  (this->super_BranchInstr).super_Instr.m_opcode = MaxByteSizedOpcodes;
  (this->super_BranchInstr).super_Instr.ignoreOverflowBitCount = ' ';
  (this->super_BranchInstr).super_Instr.highlight = 0;
  puVar1 = &(this->super_BranchInstr).super_Instr.field_0x36;
  *(ushort *)puVar1 = *(ushort *)puVar1 & 1;
  puVar1 = &(this->super_BranchInstr).super_Instr.field_0x38;
  *puVar1 = *puVar1 & 0x80;
  (this->super_BranchInstr).super_Instr.m_number = 0xffffffff;
  (this->super_BranchInstr).super_Instr.m_dst = (Opnd *)0x0;
  (this->super_BranchInstr).super_Instr.m_src1 = (Opnd *)0x0;
  (this->super_BranchInstr).super_Instr.m_src2 = (Opnd *)0x0;
  puVar1 = &(this->super_BranchInstr).field_0x58;
  *puVar1 = *puVar1 & 0xe0;
  (this->super_BranchInstr).m_branchTarget = (LabelInstr *)0x0;
  (this->super_BranchInstr).m_isHelperToNonHelperBranch = false;
  (this->super_BranchInstr).m_leaveConvToBr = false;
  (this->super_BranchInstr).super_Instr._vptr_Instr = (_func_int **)&PTR_Dump_014d5780;
  this->m_branchTargets = (void *)0x0;
  this->m_kind = IntJumpTable;
  this->m_baseCaseValue = 0;
  this->m_lastCaseValue = 0;
  (this->super_BranchInstr).m_isMultiBranch = true;
  return;
}

Assistant:

MultiBranchInstr() :
        m_branchTargets(nullptr),
        m_kind(IntJumpTable),
        m_baseCaseValue(0),
        m_lastCaseValue(0)
    {
#if DBG
        m_isMultiBranch = true;
#endif
    }